

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O3

_Bool ECDSA_Verify(COSE *pSigner,int index,eckey_t *eckey,int cbitDigest,byte *rgbToSign,
                  size_t cbToSign,cose_errback *perr)

{
  byte bVar1;
  int iVar2;
  cose_error cVar3;
  mbedtls_md_info_t *md_info;
  cn_cbor *pcVar4;
  size_t buflen;
  _Bool _Var5;
  mbedtls_md_type_t md_type;
  mbedtls_mpi r;
  byte rgbDigest [32];
  mbedtls_mpi mStack_78;
  mbedtls_mpi local_68;
  uchar local_58 [40];
  
  mbedtls_mpi_init(&local_68);
  mbedtls_mpi_init(&mStack_78);
  if (cbitDigest == 0x100) {
    md_type = MBEDTLS_MD_SHA256;
LAB_00197fc3:
    md_info = mbedtls_md_info_from_type(md_type);
    if (md_info == (mbedtls_md_info_t *)0x0) goto LAB_00197fe7;
    iVar2 = mbedtls_md(md_info,rgbToSign,cbToSign,local_58);
    if (iVar2 != 0) goto LAB_00197fe7;
    pcVar4 = _COSE_arrayget_int(pSigner,index);
    if ((pcVar4 == (cn_cbor *)0x0) || (pcVar4->type != CN_CBOR_BYTES)) goto LAB_00197fe7;
    iVar2 = mbedtls_mpi_read_binary(&local_68,(pcVar4->v).bytes,(long)(pcVar4->length / 2));
    if (iVar2 == 0) {
      buflen = (size_t)(pcVar4->length / 2);
      iVar2 = mbedtls_mpi_read_binary(&mStack_78,(pcVar4->v).bytes + buflen,buflen);
      if (iVar2 != 0) goto LAB_0019807c;
      bVar1 = mbedtls_md_get_size(md_info);
      iVar2 = mbedtls_ecdsa_verify(&eckey->grp,local_58,(ulong)bVar1,&eckey->Q,&local_68,&mStack_78)
      ;
      if (iVar2 == 0) {
        _Var5 = true;
        goto LAB_00197ffd;
      }
      cVar3 = COSE_ERR_CRYPTO_FAIL;
    }
    else {
LAB_0019807c:
      cVar3 = COSE_ERR_OUT_OF_MEMORY;
    }
  }
  else {
    if (cbitDigest == 0x200) {
      md_type = MBEDTLS_MD_SHA512;
      goto LAB_00197fc3;
    }
    if (cbitDigest == 0x180) {
      md_type = MBEDTLS_MD_SHA384;
      goto LAB_00197fc3;
    }
LAB_00197fe7:
    cVar3 = COSE_ERR_INVALID_PARAMETER;
  }
  if (perr != (cose_errback *)0x0) {
    perr->err = cVar3;
  }
  _Var5 = false;
LAB_00197ffd:
  mbedtls_mpi_free(&local_68);
  mbedtls_mpi_free(&mStack_78);
  return _Var5;
}

Assistant:

bool ECDSA_Verify(COSE * pSigner, int index, const eckey_t * eckey, int cbitDigest, const byte * rgbToSign, size_t cbToSign, cose_errback * perr)
{
	mbedtls_mpi r;
	mbedtls_mpi s;
	mbedtls_md_type_t mdType;
	const mbedtls_md_info_t *pmdInfo;
	byte rgbDigest[MBEDTLS_MD_MAX_SIZE];
	cn_cbor * pSig;
	bool result = false;

	mbedtls_mpi_init(&r);
	mbedtls_mpi_init(&s);

	switch(cbitDigest)
	{
	case 256:
		mdType = MBEDTLS_MD_SHA256;
		break;

	case 384:
		mdType = MBEDTLS_MD_SHA384;
		break;

	case 512:
		mdType = MBEDTLS_MD_SHA512;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}
	pmdInfo = mbedtls_md_info_from_type(mdType);
	CHECK_CONDITION(pmdInfo != NULL, COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(mbedtls_md(pmdInfo, rgbToSign, cbToSign, rgbDigest) == 0, COSE_ERR_INVALID_PARAMETER);

	pSig = _COSE_arrayget_int(pSigner, index);
	CHECK_CONDITION((pSig != NULL) && (pSig->type == CN_CBOR_BYTES), COSE_ERR_INVALID_PARAMETER);

	CHECK_CONDITION(mbedtls_mpi_read_binary( &r, pSig->v.bytes, pSig->length / 2 ) == 0, COSE_ERR_OUT_OF_MEMORY);
	CHECK_CONDITION(mbedtls_mpi_read_binary( &s, pSig->v.bytes + pSig->length / 2, pSig->length / 2 ) == 0, COSE_ERR_OUT_OF_MEMORY);
	CHECK_CONDITION(mbedtls_ecdsa_verify((mbedtls_ecp_group*)&eckey->grp, rgbDigest, mbedtls_md_get_size(pmdInfo), &eckey->Q, &r, &s) == 0, COSE_ERR_CRYPTO_FAIL);

	result = true;

errorReturn:
	mbedtls_mpi_free(&r);
	mbedtls_mpi_free(&s);
	return result;
}